

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

void __thiscall wabt::AST::~AST(AST *this)

{
  AST *this_local;
  
  if (this->f != (Func *)0x0) {
    ModuleContext::EndFunc(this->mc);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->blocks_closed);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->block_stack);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
  ::~map(&this->vars_defined);
  std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&this->predecls);
  std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&this->exp_stack);
  return;
}

Assistant:

~AST() {
    if (f) mc.EndFunc();
  }